

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 anon_unknown.dwarf_33386e4::InferXOnlyPubkey
           (XOnlyPubKey *xkey,ParseScriptContext ctx,SigningProvider *provider)

{
  bool bVar1;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *in_RCX;
  undefined4 in_EDX;
  int *in_RSI;
  tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  in_RDI;
  long in_FS_OFFSET;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  key_provider;
  KeyOriginInfo info;
  CPubKey pubkey;
  KeyOriginInfo *in_stack_fffffffffffffef8;
  unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  *in_stack_ffffffffffffff00;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> this;
  CPubKey *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  XOnlyPubKey *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  bool local_80 [55];
  XOnlyPubKey local_49 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this._M_head_impl =
       (PubkeyProvider *)
       in_RDI.
       super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
       .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
  XOnlyPubKey::GetEvenCorrespondingCPubKey(local_49);
  std::make_unique<(anonymous_namespace)::ConstPubkeyProvider,int,CPubKey&,bool>
            ((int *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,local_80);
  std::
  unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>
  ::
  unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>,void>
            ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              *)this._M_head_impl,in_stack_ffffffffffffff00);
  std::
  unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                 *)this._M_head_impl);
  KeyOriginInfo::KeyOriginInfo(in_stack_fffffffffffffef8);
  bVar1 = SigningProvider::GetKeyOriginByXOnly
                    ((SigningProvider *)in_RCX,in_stack_ffffffffffffff40,
                     (KeyOriginInfo *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  if (bVar1) {
    std::
    make_unique<(anonymous_namespace)::OriginPubkeyProvider,int,KeyOriginInfo,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,bool>
              (in_RSI,(KeyOriginInfo *)CONCAT44(in_EDX,in_stack_ffffffffffffff50),in_RCX,
               (bool *)in_stack_ffffffffffffff40);
    std::
    unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>
    ::
    unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>,void>
              ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                *)this._M_head_impl,
               (unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                *)in_stack_ffffffffffffff00);
    std::
    unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                   *)this._M_head_impl);
  }
  else {
    std::
    unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
    ::unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)in_stack_fffffffffffffef8,
                 (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)0x1a1a3a4);
  }
  KeyOriginInfo::~KeyOriginInfo(in_stack_fffffffffffffef8);
  std::
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 *)this._M_head_impl);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )in_RDI.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> InferXOnlyPubkey(const XOnlyPubKey& xkey, ParseScriptContext ctx, const SigningProvider& provider)
{
    CPubKey pubkey{xkey.GetEvenCorrespondingCPubKey()};
    std::unique_ptr<PubkeyProvider> key_provider = std::make_unique<ConstPubkeyProvider>(0, pubkey, true);
    KeyOriginInfo info;
    if (provider.GetKeyOriginByXOnly(xkey, info)) {
        return std::make_unique<OriginPubkeyProvider>(0, std::move(info), std::move(key_provider), /*apostrophe=*/false);
    }
    return key_provider;
}